

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

void __thiscall testing::Matcher<bool>::Matcher(Matcher<bool> *this,bool value)

{
  linked_ptr<const_testing::MatcherInterface<bool>_> local_38;
  
  (this->super_MatcherBase<bool>).impl_.value_ = (MatcherInterface<bool> *)0x0;
  (this->super_MatcherBase<bool>).impl_.link_.next_ = &(this->super_MatcherBase<bool>).impl_.link_;
  (this->super_MatcherBase<bool>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001d6c28;
  local_38.value_ = (MatcherInterface<bool> *)operator_new(0x10);
  ((local_38.value_)->super_MatcherDescriberInterface)._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherDescriberInterface_001d6e68;
  *(bool *)&local_38.value_[1].super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       value;
  local_38.link_.next_ = &local_38.link_;
  internal::linked_ptr<const_testing::MatcherInterface<bool>_>::operator=
            (&(this->super_MatcherBase<bool>).impl_,&local_38);
  internal::linked_ptr<const_testing::MatcherInterface<bool>_>::~linked_ptr(&local_38);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }